

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_bcons.cc
# Opt level: O1

void * v2i_BASIC_CONSTRAINTS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *values)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  ASN1_VALUE *val;
  size_t sVar3;
  CONF_VALUE *value;
  size_t sVar4;
  
  val = ASN1_item_new((ASN1_ITEM *)&BASIC_CONSTRAINTS_it);
  if (val != (ASN1_VALUE *)0x0) {
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)values);
    if (sVar3 == 0) {
      return val;
    }
    sVar3 = 0;
    do {
      value = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)values,sVar3);
      __s1 = value->name;
      iVar2 = strcmp(__s1,"CA");
      if (iVar2 == 0) {
        iVar2 = X509V3_get_value_bool(value,(int *)val);
LAB_004ad59f:
        if (iVar2 == 0) {
          iVar2 = 5;
          bVar1 = false;
        }
        else {
          iVar2 = 0;
          bVar1 = true;
        }
      }
      else {
        iVar2 = strcmp(__s1,"pathlen");
        if (iVar2 == 0) {
          iVar2 = X509V3_get_value_int(value,(ASN1_INTEGER **)(val + 8));
          goto LAB_004ad59f;
        }
        bVar1 = false;
        ERR_put_error(0x14,0,0x7b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_bcons.cc"
                      ,0x56);
        ERR_add_error_data(6,"section:",value->section,",name:",value->name,",value:",value->value);
        iVar2 = 5;
      }
      if (!bVar1) goto LAB_004ad5d0;
      sVar3 = sVar3 + 1;
      sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)values);
    } while (sVar3 < sVar4);
    iVar2 = 2;
LAB_004ad5d0:
    if (iVar2 != 5) {
      return val;
    }
    ASN1_item_free(val,(ASN1_ITEM *)&BASIC_CONSTRAINTS_it);
  }
  return (void *)0x0;
}

Assistant:

static void *v2i_BASIC_CONSTRAINTS(const X509V3_EXT_METHOD *method,
                                   const X509V3_CTX *ctx,
                                   const STACK_OF(CONF_VALUE) *values) {
  BASIC_CONSTRAINTS *bcons = NULL;
  if (!(bcons = BASIC_CONSTRAINTS_new())) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(values); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(values, i);
    if (!strcmp(val->name, "CA")) {
      if (!X509V3_get_value_bool(val, &bcons->ca)) {
        goto err;
      }
    } else if (!strcmp(val->name, "pathlen")) {
      if (!X509V3_get_value_int(val, &bcons->pathlen)) {
        goto err;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NAME);
      X509V3_conf_err(val);
      goto err;
    }
  }
  return bcons;
err:
  BASIC_CONSTRAINTS_free(bcons);
  return NULL;
}